

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall spirv_cross::CompilerGLSL::variable_is_lut(CompilerGLSL *this,SPIRVariable *var)

{
  Variant *pVVar1;
  bool bVar2;
  ulong uVar3;
  SPIRConstant *pSVar4;
  
  if (((var->statically_assigned == true) &&
      (uVar3 = (ulong)(var->static_expression).id, uVar3 != 0)) && (var->remapped_variable == true))
  {
    if ((uVar3 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size)
       && (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
          pVVar1[uVar3].type == TypeConstant)) {
      pSVar4 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar3);
    }
    else {
      pSVar4 = (SPIRConstant *)0x0;
    }
    if ((pSVar4 == (SPIRConstant *)0x0) || (bVar2 = true, pSVar4->is_used_as_lut == false)) {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool CompilerGLSL::variable_is_lut(const SPIRVariable &var) const
{
	bool statically_assigned = var.statically_assigned && var.static_expression != ID(0) && var.remapped_variable;

	if (statically_assigned)
	{
		auto *constant = maybe_get<SPIRConstant>(var.static_expression);
		if (constant && constant->is_used_as_lut)
			return true;
	}

	return false;
}